

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

void Abc_NodeDelayTraceArrival(Abc_Obj_t *pNode,Vec_Int_t *vSlacks)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  float *pfVar3;
  long *plVar4;
  float *pfVar5;
  Mio_PinPhase_t MVar6;
  Mio_Pin_t *pMVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  pAVar2 = pNode->pNtk;
  pfVar3 = (float *)pAVar2->pManTime->vArrs->pArray[pNode->Id];
  pfVar3[0] = -1e+09;
  pfVar3[1] = -1e+09;
  if ((((pAVar2->ntkFunc == ABC_FUNC_MAP) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) &&
      ((pNode->vFanins).nSize == 1)) && ((pNode->field_5).pData == (void *)0x0)) {
    plVar4 = (long *)pAVar2->vObjs->pArray[*(pNode->vFanins).pArray];
    *(undefined8 *)pfVar3 =
         **(undefined8 **)
           (*(long *)(*(long *)(*(long *)(*plVar4 + 0x108) + 0x10) + 8) + (long)(int)plVar4[2] * 8);
  }
  else {
    pMVar7 = Mio_GateReadPins((Mio_Gate_t *)(pNode->field_5).pData);
    if (0 < (pNode->vFanins).nSize) {
      lVar10 = 0;
      do {
        plVar4 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar10]];
        pfVar5 = *(float **)
                  (*(long *)(*(long *)(*(long *)(*plVar4 + 0x108) + 0x10) + 8) +
                  (long)(int)plVar4[2] * 8);
        MVar6 = Mio_PinReadPhase(pMVar7);
        dVar12 = Mio_PinReadDelayBlockRise(pMVar7);
        dVar13 = Mio_PinReadDelayBlockFall(pMVar7);
        fVar11 = *pfVar3;
        if (MVar6 == MIO_PHASE_INV) {
LAB_0031c15a:
          fVar15 = (float)dVar12 + pfVar5[1];
          if (fVar11 < fVar15) {
            *pfVar3 = fVar15;
          }
          fVar11 = (float)dVar13 + *pfVar5;
          if (pfVar3[1] <= fVar11 && fVar11 != pfVar3[1]) {
            pfVar3[1] = fVar11;
          }
        }
        else {
          fVar15 = *pfVar5 + (float)dVar12;
          if (fVar11 < fVar15) {
            *pfVar3 = fVar15;
            fVar11 = fVar15;
          }
          fVar15 = pfVar5[1] + (float)dVar13;
          if (pfVar3[1] <= fVar15 && fVar15 != pfVar3[1]) {
            pfVar3[1] = fVar15;
          }
          if (MVar6 != MIO_PHASE_NONINV) goto LAB_0031c15a;
        }
        pMVar7 = Mio_PinReadNext(pMVar7);
        lVar10 = lVar10 + 1;
      } while (lVar10 < (pNode->vFanins).nSize);
    }
    if ((vSlacks != (Vec_Int_t *)0x0) &&
       (pMVar7 = Mio_GateReadPins((Mio_Gate_t *)(pNode->field_5).pData), 0 < (pNode->vFanins).nSize)
       ) {
      lVar10 = 0;
      do {
        plVar4 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar10]];
        pfVar5 = *(float **)
                  (*(long *)(*(long *)(*(long *)(*plVar4 + 0x108) + 0x10) + 8) +
                  (long)(int)plVar4[2] * 8);
        MVar6 = Mio_PinReadPhase(pMVar7);
        dVar12 = Mio_PinReadDelayBlockRise(pMVar7);
        dVar13 = Mio_PinReadDelayBlockFall(pMVar7);
        if (MVar6 == MIO_PHASE_INV) {
          fVar11 = *pfVar5;
          fVar15 = pfVar5[1];
          fVar14 = pfVar3[1];
          fVar18 = 1e+09;
LAB_0031c2ad:
          fVar16 = (fVar15 + (float)dVar12) - *pfVar3;
          fVar15 = -fVar16;
          if (-fVar16 <= fVar16) {
            fVar15 = fVar16;
          }
          if (fVar15 <= fVar18) {
            fVar18 = fVar15;
          }
          fVar14 = (fVar11 + (float)dVar13) - fVar14;
          fVar11 = -fVar14;
          if (-fVar14 <= fVar14) {
            fVar11 = fVar14;
          }
          if (fVar11 <= fVar18) {
            fVar18 = fVar11;
          }
        }
        else {
          fVar11 = *pfVar5;
          fVar15 = pfVar5[1];
          fVar18 = (fVar11 + (float)dVar12) - *pfVar3;
          fVar14 = -fVar18;
          if (-fVar18 <= fVar18) {
            fVar14 = fVar18;
          }
          fVar18 = 1e+09;
          if (fVar14 <= 1e+09) {
            fVar18 = fVar14;
          }
          fVar14 = pfVar3[1];
          fVar17 = (fVar15 + (float)dVar13) - fVar14;
          fVar16 = -fVar17;
          if (-fVar17 <= fVar17) {
            fVar16 = fVar17;
          }
          if (fVar16 <= fVar18) {
            fVar18 = fVar16;
          }
          if (MVar6 != MIO_PHASE_NONINV) goto LAB_0031c2ad;
        }
        pMVar7 = Mio_PinReadNext(pMVar7);
        iVar1 = pNode->Id;
        if (((long)iVar1 < 0) || (vSlacks->nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar9 = (ulong)(uint)vSlacks->pArray[iVar1] + lVar10;
        uVar8 = (uint)uVar9;
        if (((int)uVar8 < 0) || ((uint)vSlacks->nSize <= uVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vSlacks->pArray[uVar9 & 0xffffffff] = (int)fVar18;
        lVar10 = lVar10 + 1;
      } while (lVar10 < (pNode->vFanins).nSize);
    }
  }
  return;
}

Assistant:

void Abc_NodeDelayTraceArrival( Abc_Obj_t * pNode, Vec_Int_t * vSlacks )
{
    Abc_Obj_t * pFanin;
    Abc_Time_t * pTimeIn, * pTimeOut;
    float tDelayBlockRise, tDelayBlockFall;
    Mio_PinPhase_t PinPhase;
    Mio_Pin_t * pPin;
    int i;

    // start the arrival time of the node
    pTimeOut = Abc_NodeArrival(pNode);
    pTimeOut->Rise = pTimeOut->Fall = -ABC_INFINITY; 
    // consider the buffer
    if ( Abc_ObjIsBarBuf(pNode) )
    {
        pTimeIn = Abc_NodeArrival(Abc_ObjFanin0(pNode));
        *pTimeOut = *pTimeIn;
        return;
    }
    // go through the pins of the gate
    pPin = Mio_GateReadPins((Mio_Gate_t *)pNode->pData);
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        pTimeIn = Abc_NodeArrival(pFanin);
        // get the interesting parameters of this pin
        PinPhase = Mio_PinReadPhase(pPin);
        tDelayBlockRise = (float)Mio_PinReadDelayBlockRise( pPin );  
        tDelayBlockFall = (float)Mio_PinReadDelayBlockFall( pPin );  
        // compute the arrival times of the positive phase
        if ( PinPhase != MIO_PHASE_INV )  // NONINV phase is present
        {
            if ( pTimeOut->Rise < pTimeIn->Rise + tDelayBlockRise )
                pTimeOut->Rise = pTimeIn->Rise + tDelayBlockRise;
            if ( pTimeOut->Fall < pTimeIn->Fall + tDelayBlockFall )
                pTimeOut->Fall = pTimeIn->Fall + tDelayBlockFall;
        }
        if ( PinPhase != MIO_PHASE_NONINV )  // INV phase is present
        {
            if ( pTimeOut->Rise < pTimeIn->Fall + tDelayBlockRise )
                pTimeOut->Rise = pTimeIn->Fall + tDelayBlockRise;
            if ( pTimeOut->Fall < pTimeIn->Rise + tDelayBlockFall )
                pTimeOut->Fall = pTimeIn->Rise + tDelayBlockFall;
        }
        pPin = Mio_PinReadNext(pPin);
    }

    // compute edge slacks
    if ( vSlacks )
    {
        float Slack;
        // go through the pins of the gate
        pPin = Mio_GateReadPins((Mio_Gate_t *)pNode->pData);
        Abc_ObjForEachFanin( pNode, pFanin, i )
        {
            pTimeIn = Abc_NodeArrival(pFanin);
            // get the interesting parameters of this pin
            PinPhase = Mio_PinReadPhase(pPin);
            tDelayBlockRise = (float)Mio_PinReadDelayBlockRise( pPin );  
            tDelayBlockFall = (float)Mio_PinReadDelayBlockFall( pPin );  
            // compute the arrival times of the positive phase
            Slack = ABC_INFINITY;
            if ( PinPhase != MIO_PHASE_INV )  // NONINV phase is present
            {
                Slack = Abc_MinFloat( Slack, Abc_AbsFloat(pTimeIn->Rise + tDelayBlockRise - pTimeOut->Rise) );
                Slack = Abc_MinFloat( Slack, Abc_AbsFloat(pTimeIn->Fall + tDelayBlockFall - pTimeOut->Fall) );
            }
            if ( PinPhase != MIO_PHASE_NONINV )  // INV phase is present
            {
                Slack = Abc_MinFloat( Slack, Abc_AbsFloat(pTimeIn->Fall + tDelayBlockRise - pTimeOut->Rise) );
                Slack = Abc_MinFloat( Slack, Abc_AbsFloat(pTimeIn->Rise + tDelayBlockFall - pTimeOut->Fall) );
            }
            pPin = Mio_PinReadNext(pPin);
            Abc_NtkDelayTraceSetSlack( vSlacks, pNode, i, Slack );
        }
    }
}